

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O1

word * Abc_NodeConeTruth(Vec_Ptr_t *vVars,Vec_Ptr_t *vFuncs,int nWordsMax,Abc_Obj_t *pRoot,
                        Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  void *pvVar7;
  void **ppvVar8;
  word *pwVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  Abc_Obj_t *local_38;
  
  uVar5 = 1 << ((char)vLeaves->nSize - 6U & 0x1f);
  if (vLeaves->nSize < 7) {
    uVar5 = 1;
  }
  local_38 = pRoot;
  Abc_NodeConeCollect(&local_38,1,vLeaves,vVisited,0);
  if (0 < vLeaves->nSize) {
    lVar6 = 0;
    do {
      if (vVars->nSize <= lVar6) goto LAB_00290416;
      *(void **)((long)vLeaves->pArray[lVar6] + 0x40) = vVars->pArray[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < vLeaves->nSize);
  }
  iVar11 = vFuncs->nSize;
  if (iVar11 < vVisited->nSize) {
    do {
      pvVar7 = malloc((long)nWordsMax << 3);
      uVar1 = vFuncs->nCap;
      if (vFuncs->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vFuncs->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(vFuncs->pArray,0x80);
          }
          vFuncs->pArray = ppvVar8;
          iVar13 = 0x10;
        }
        else {
          iVar13 = uVar1 * 2;
          if (iVar13 <= (int)uVar1) goto LAB_002902cf;
          if (vFuncs->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(vFuncs->pArray,(ulong)uVar1 << 4);
          }
          vFuncs->pArray = ppvVar8;
        }
        vFuncs->nCap = iVar13;
      }
LAB_002902cf:
      iVar13 = vFuncs->nSize;
      vFuncs->nSize = iVar13 + 1;
      vFuncs->pArray[iVar13] = pvVar7;
      iVar11 = iVar11 + 1;
    } while (iVar11 < vVisited->nSize);
  }
  if (vVisited->nSize < 1) {
    pwVar9 = (word *)0x0;
  }
  else {
    uVar10 = (ulong)uVar5;
    lVar6 = 0;
    do {
      plVar2 = (long *)vVisited->pArray[lVar6];
      uVar1 = *(uint *)((long)plVar2 + 0x14);
      if ((uVar1 & 0xf) == 2) {
        __assert_fail("!Abc_ObjIsPi(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRefactor.c"
                      ,0x61,
                      "word *Abc_NodeConeTruth(Vec_Ptr_t *, Vec_Ptr_t *, int, Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      if (vFuncs->nSize <= lVar6) {
LAB_00290416:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar3 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
      lVar4 = *(long *)(*(long *)(lVar3 + (long)*(int *)plVar2[4] * 8) + 0x40);
      lVar3 = *(long *)(*(long *)(lVar3 + (long)((int *)plVar2[4])[1] * 8) + 0x40);
      pwVar9 = (word *)vFuncs->pArray[lVar6];
      if ((uVar1 >> 10 & 1) == 0) {
        if ((uVar1 >> 0xb & 1) == 0) {
          if (0 < (int)uVar5) {
            uVar12 = 0;
            do {
              pwVar9[uVar12] = *(ulong *)(lVar3 + uVar12 * 8) & *(ulong *)(lVar4 + uVar12 * 8);
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
          }
        }
        else if (0 < (int)uVar5) {
          uVar12 = 0;
          do {
            pwVar9[uVar12] = ~*(ulong *)(lVar3 + uVar12 * 8) & *(ulong *)(lVar4 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
      }
      else if ((uVar1 >> 0xb & 1) == 0) {
        if (0 < (int)uVar5) {
          uVar12 = 0;
          do {
            pwVar9[uVar12] = ~*(ulong *)(lVar4 + uVar12 * 8) & *(ulong *)(lVar3 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
      }
      else if (0 < (int)uVar5) {
        uVar12 = 0;
        do {
          pwVar9[uVar12] = ~(*(ulong *)(lVar3 + uVar12 * 8) | *(ulong *)(lVar4 + uVar12 * 8));
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      plVar2[8] = (long)pwVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vVisited->nSize);
  }
  return pwVar9;
}

Assistant:

word * Abc_NodeConeTruth( Vec_Ptr_t * vVars, Vec_Ptr_t * vFuncs, int nWordsMax, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited )
{
    Abc_Obj_t * pNode;
    word * pTruth0, * pTruth1, * pTruth = NULL;
    int i, k, nWords = Abc_Truth6WordNum( Vec_PtrSize(vLeaves) );
    // get nodes in the cut without fanins in the DFS order
    Abc_NodeConeCollect( &pRoot, 1, vLeaves, vVisited, 0 );
    // set elementary functions
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vVars, i );
    // prepare functions
    for ( i = Vec_PtrSize(vFuncs); i < Vec_PtrSize(vVisited); i++ )
        Vec_PtrPush( vFuncs, ABC_ALLOC(word, nWordsMax) );
    // compute functions for the collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
    {
        assert( !Abc_ObjIsPi(pNode) );
        pTruth0 = (word *)Abc_ObjFanin0(pNode)->pCopy;
        pTruth1 = (word *)Abc_ObjFanin1(pNode)->pCopy;
        pTruth  = (word *)Vec_PtrEntry( vFuncs, i );
        if ( Abc_ObjFaninC0(pNode) )
        {
            if ( Abc_ObjFaninC1(pNode) )
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] = ~pTruth0[k] & ~pTruth1[k];
            else
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] = ~pTruth0[k] &  pTruth1[k];
        }
        else
        {
            if ( Abc_ObjFaninC1(pNode) )
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] =  pTruth0[k] & ~pTruth1[k];
            else
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] =  pTruth0[k] &  pTruth1[k];
        }
        pNode->pCopy = (Abc_Obj_t *)pTruth;
    }
    return pTruth;
}